

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

uint64_t __thiscall BitStreamReader<SpanReader>::Read(BitStreamReader<SpanReader> *this,int nbits)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  out_of_range *this_00;
  byte bVar4;
  size_t in_RCX;
  int iVar5;
  byte bVar6;
  uint64_t uVar7;
  long in_FS_OFFSET;
  uint8_t obj;
  byte local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)nbits < 0x41) {
    if (nbits == 0) {
      uVar7 = 0;
    }
    else {
      iVar3 = this->m_offset;
      uVar7 = 0;
      do {
        if (iVar3 == 8) {
          SpanReader::read(this->m_istream,(int)&local_29,(void *)0x1,in_RCX);
          this->m_buffer = local_29;
          this->m_offset = 0;
          iVar3 = 0;
          bVar6 = local_29;
        }
        else {
          bVar6 = this->m_buffer;
        }
        iVar2 = 8 - iVar3;
        if (nbits < 8 - iVar3) {
          iVar2 = nbits;
        }
        bVar4 = 8 - (byte)iVar2;
        in_RCX = (size_t)CONCAT31((int3)((uint)iVar3 >> 8),bVar4);
        uVar7 = uVar7 << ((byte)iVar2 & 0x3f) |
                (ulong)(((uint)bVar6 << ((byte)iVar3 & 0x1f) & 0xff) >> (bVar4 & 0x1f));
        iVar3 = iVar3 + iVar2;
        this->m_offset = iVar3;
        iVar5 = nbits - iVar2;
        bVar1 = iVar2 <= nbits;
        nbits = iVar5;
      } while (iVar5 != 0 && bVar1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return uVar7;
    }
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"nbits must be between 0 and 64");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t Read(int nbits) {
        if (nbits < 0 || nbits > 64) {
            throw std::out_of_range("nbits must be between 0 and 64");
        }

        uint64_t data = 0;
        while (nbits > 0) {
            if (m_offset == 8) {
                m_istream >> m_buffer;
                m_offset = 0;
            }

            int bits = std::min(8 - m_offset, nbits);
            data <<= bits;
            data |= static_cast<uint8_t>(m_buffer << m_offset) >> (8 - bits);
            m_offset += bits;
            nbits -= bits;
        }
        return data;
    }